

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *this,
          DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  SimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false> *this_00;
  SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false> *other;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar5;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar6;
  unsigned_short uStack_26;
  int local_24;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  int i;
  SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
  *newTypeHandler;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_local;
  
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x23b,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = (SimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false> *)
            ConvertToTypeHandler<Js::SimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>,Js::JavascriptString*>
                      (this,instance);
  if (((byte)this[0x28] >> 1 & 1) == 0) {
    local_24 = 0;
    while( true ) {
      pBVar5 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)(this + 0x18));
      iVar3 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
              ::Count(pBVar5);
      if (iVar3 <= local_24) break;
      pBVar5 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)(this + 0x18));
      pSVar6 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar5,local_24);
      if (((uint)*pSVar6 & 0x800) != 0) {
        uStack_26 = (*pSVar6).propertyIndex;
        SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>::
        TryRegisterDeletedPropertyIndex
                  ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                    *)this_00,instance,uStack_26);
      }
      local_24 = local_24 + 1;
    }
  }
  else {
    other = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
            AsUnordered((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
                         *)this);
    SimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>::
    CopyUnorderedStateFrom<unsigned_short,Js::PropertyRecord_const*,false>(this_00,other,instance);
  }
  return (SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false> *)
         this_00;
}

Assistant:

SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToSimpleDictionaryUnorderedTypeHandler(DynamicObject* instance)
    {
        CompileAssert(sizeof(NewTPropertyIndex) >= sizeof(TPropertyIndex));
        Assert(instance);

        SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported> *const newTypeHandler =
            ConvertToTypeHandler<SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>, NewTMapKey>(instance);

        if(isUnordered)
        {
            newTypeHandler->CopyUnorderedStateFrom(*AsUnordered(), instance);
        }
        else
        {
            for(int i = 0; i < propertyMap->Count(); ++i)
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(i));
                if(descriptor.Attributes & PropertyDeleted)
                {
                    newTypeHandler->TryRegisterDeletedPropertyIndex(instance, descriptor.propertyIndex);
                }
            }
        }

        return newTypeHandler;
    }